

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

strbuf * ppk_save_sb(ssh2_userkey *key,char *passphrase,ppk_save_parameters *params_orig)

{
  BinarySink *pBVar1;
  int iVar2;
  ptrlen data;
  ptrlen input;
  ptrlen input_00;
  ptrlen passphrase_salt;
  uint uVar3;
  undefined8 uVar4;
  strbuf *buf_o;
  strbuf *buf_o_00;
  void *__s;
  strbuf *buf_o_01;
  void *buf;
  strbuf *storage;
  strbuf *psVar5;
  char *pcVar6;
  char *pcVar7;
  size_t factor1;
  ulong uVar8;
  ssh2_macalg *psVar9;
  int iVar10;
  ppk_cipher *ppVar11;
  size_t i;
  ulong uVar12;
  bool bVar13;
  ptrlen pVar14;
  size_t *local_f0;
  ppk_save_parameters params;
  ptrlen mackey;
  ptrlen cipherkey;
  uchar priv_mac [32];
  ptrlen cipheriv;
  
  buf_o = strbuf_new();
  (*key->key->vt->public_blob)(key->key,buf_o->binarysink_);
  buf_o_00 = strbuf_new_nm();
  (*key->key->vt->private_blob)(key->key,buf_o_00->binarysink_);
  bVar13 = passphrase == (char *)0x0;
  ppVar11 = &ppk_cipher_aes256_cbc;
  if (bVar13) {
    ppVar11 = &ppk_cipher_none;
  }
  pcVar6 = "aes256-cbc";
  if (bVar13) {
    pcVar6 = "none";
  }
  iVar2 = 0x10;
  if (bVar13) {
    iVar2 = 1;
  }
  iVar10 = iVar2 + (int)buf_o_00->len + -1;
  iVar10 = iVar10 - iVar10 % iVar2;
  factor1 = (size_t)iVar10;
  __s = safemalloc(factor1,1,0);
  memset(__s,0,factor1);
  memcpy(__s,buf_o_00->u,buf_o_00->len);
  pVar14.ptr = buf_o_00->u;
  pVar14.len = buf_o_00->len;
  hash_simple(&ssh_sha1,pVar14,priv_mac);
  uVar8 = factor1 - buf_o_00->len;
  if (0x13 < uVar8) {
    __assert_fail("priv_encrypted_len - priv_blob->len < 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                  0x5d3,
                  "strbuf *ppk_save_sb(ssh2_userkey *, const char *, const ppk_save_parameters *)");
  }
  memcpy((void *)(buf_o_00->len + (long)__s),priv_mac,uVar8);
  params.saltlen = params_orig->saltlen;
  params.fmt_version = params_orig->fmt_version;
  params.argon2_flavour = params_orig->argon2_flavour;
  params.argon2_mem = params_orig->argon2_mem;
  params.argon2_passes_auto = params_orig->argon2_passes_auto;
  params._13_3_ = *(undefined3 *)&params_orig->field_0xd;
  params.field_4 = params_orig->field_4;
  params.argon2_parallelism = params_orig->argon2_parallelism;
  params.salt = params_orig->salt;
  buf_o_01 = strbuf_new();
  uVar3 = params.fmt_version;
  if (params.fmt_version == 3) {
    if (params.salt == (uint8_t *)0x0) {
      buf = strbuf_append(buf_o_01,0x10);
      random_read(buf,0x10);
    }
    else {
      BinarySink_put_data(buf_o_01->binarysink_,params.salt,params.saltlen);
    }
  }
  storage = strbuf_new();
  pcVar7 = "";
  if (passphrase != (char *)0x0) {
    pcVar7 = passphrase;
  }
  pVar14 = ptrlen_from_asciz(pcVar7);
  passphrase_salt.ptr = buf_o_01->u;
  passphrase_salt.len = buf_o_01->len;
  ssh2_ppk_derive_keys
            (uVar3,ppVar11,pVar14,storage,&cipherkey,&cipheriv,&mackey,passphrase_salt,&params);
  uVar4 = params._0_8_;
  uVar3 = params.fmt_version;
  if (params.fmt_version == 2) {
    psVar9 = &ssh_hmac_sha1;
  }
  else {
    psVar9 = &ssh_hmac_sha256;
  }
  psVar5 = strbuf_new_nm();
  pBVar1 = psVar5->binarysink_;
  BinarySink_put_stringz(pBVar1,key->key->vt->ssh_id);
  BinarySink_put_stringz(pBVar1,pcVar6);
  BinarySink_put_stringz(pBVar1,key->comment);
  BinarySink_put_string(pBVar1,buf_o->s,buf_o->len);
  BinarySink_put_string(pBVar1,__s,factor1);
  data.ptr = psVar5->u;
  data.len = psVar5->len;
  mac_simple(psVar9,mackey,data,priv_mac);
  strbuf_free(psVar5);
  if (passphrase == (char *)0x0) {
    ppVar11 = &ppk_cipher_none;
  }
  else {
    if (cipherkey.len != 0x20) {
      __assert_fail("cipherkey.len == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                    0x5ff,
                    "strbuf *ppk_save_sb(ssh2_userkey *, const char *, const ppk_save_parameters *)"
                   );
    }
    aes256_encrypt_pubkey(cipherkey.ptr,cipheriv.ptr,__s,iVar10);
    ppVar11 = &ppk_cipher_aes256_cbc;
  }
  local_f0 = &ppVar11->keylen;
  psVar5 = strbuf_new_nm();
  pBVar1 = psVar5->binarysink_;
  uVar8 = 0;
  BinarySink_put_fmt(pBVar1,"PuTTY-User-Key-File-%u: %s\n",uVar4 & 0xffffffff,key->key->vt->ssh_id);
  BinarySink_put_fmt(pBVar1,"Encryption: %s\n",pcVar6);
  BinarySink_put_fmt(pBVar1,"Comment: %s\n",key->comment);
  BinarySink_put_fmt(pBVar1,"Public-Lines: %d\n",(long)((int)buf_o->len + 0x2f) / 0x30 & 0xffffffff)
  ;
  input.ptr = buf_o->u;
  input.len = buf_o->len;
  base64_encode_bs(pBVar1,input,0x40);
  if ((uVar3 == 3) && (*local_f0 != 0)) {
    pcVar6 = "Argon2id";
    if (params.argon2_flavour == Argon2i) {
      pcVar6 = "Argon2i";
    }
    pcVar7 = "Argon2d";
    if (params.argon2_flavour != Argon2d) {
      pcVar7 = pcVar6;
    }
    BinarySink_put_fmt(pBVar1,"Key-Derivation: %s\n",pcVar7);
    BinarySink_put_fmt(pBVar1,"Argon2-Memory: %u\n",params._8_8_ & 0xffffffff);
    if (params.argon2_passes_auto == true) {
      __assert_fail("!params.argon2_passes_auto",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                    0x610,
                    "strbuf *ppk_save_sb(ssh2_userkey *, const char *, const ppk_save_parameters *)"
                   );
    }
    BinarySink_put_fmt(pBVar1,"Argon2-Passes: %u\n",params._16_8_ & 0xffffffff);
    BinarySink_put_fmt(pBVar1,"Argon2-Parallelism: %u\n",(ulong)params._16_8_ >> 0x20);
    BinarySink_put_fmt(pBVar1,"Argon2-Salt: ");
    for (uVar12 = 0; uVar12 < buf_o_01->len; uVar12 = uVar12 + 1) {
      BinarySink_put_fmt(pBVar1,"%02x",(ulong)buf_o_01->u[uVar12]);
    }
    BinarySink_put_fmt(pBVar1,"\n");
  }
  BinarySink_put_fmt(pBVar1,"Private-Lines: %d\n",(long)(iVar10 + 0x2f) / 0x30 & 0xffffffff);
  input_00.len = factor1;
  input_00.ptr = __s;
  base64_encode_bs(pBVar1,input_00,0x40);
  BinarySink_put_fmt(pBVar1,"Private-MAC: ");
  if (uVar3 == 2) {
    psVar9 = &ssh_hmac_sha1;
  }
  else {
    psVar9 = &ssh_hmac_sha256;
  }
  uVar12 = (ulong)(uint)psVar9->len;
  if (psVar9->len < 1) {
    uVar12 = uVar8;
  }
  for (; uVar12 != uVar8; uVar8 = uVar8 + 1) {
    BinarySink_put_fmt(pBVar1,"%02x",(ulong)priv_mac[uVar8]);
  }
  BinarySink_put_fmt(pBVar1,"\n");
  strbuf_free(storage);
  strbuf_free(buf_o_01);
  strbuf_free(buf_o);
  strbuf_free(buf_o_00);
  smemclr(__s,factor1);
  safefree(__s);
  return psVar5;
}

Assistant:

strbuf *ppk_save_sb(ssh2_userkey *key, const char *passphrase,
                    const ppk_save_parameters *params_orig)
{
    strbuf *pub_blob, *priv_blob, *cipher_mac_keys_blob;
    unsigned char *priv_blob_encrypted;
    int priv_encrypted_len;
    int cipherblk;
    int i;
    const char *cipherstr;
    ptrlen cipherkey, cipheriv, mackey;
    const struct ppk_cipher *ciphertype;
    unsigned char priv_mac[32];

    /*
     * Fetch the key component blobs.
     */
    pub_blob = strbuf_new();
    ssh_key_public_blob(key->key, BinarySink_UPCAST(pub_blob));
    priv_blob = strbuf_new_nm();
    ssh_key_private_blob(key->key, BinarySink_UPCAST(priv_blob));

    /*
     * Determine encryption details, and encrypt the private blob.
     */
    if (passphrase) {
        cipherstr = "aes256-cbc";
        cipherblk = 16;
        ciphertype = &ppk_cipher_aes256_cbc;
    } else {
        cipherstr = "none";
        cipherblk = 1;
        ciphertype = &ppk_cipher_none;
    }
    priv_encrypted_len = priv_blob->len + cipherblk - 1;
    priv_encrypted_len -= priv_encrypted_len % cipherblk;
    priv_blob_encrypted = snewn(priv_encrypted_len, unsigned char);
    memset(priv_blob_encrypted, 0, priv_encrypted_len);
    memcpy(priv_blob_encrypted, priv_blob->u, priv_blob->len);
    /* Create padding based on the SHA hash of the unpadded blob. This prevents
     * too easy a known-plaintext attack on the last block. */
    hash_simple(&ssh_sha1, ptrlen_from_strbuf(priv_blob), priv_mac);
    assert(priv_encrypted_len - priv_blob->len < 20);
    memcpy(priv_blob_encrypted + priv_blob->len, priv_mac,
           priv_encrypted_len - priv_blob->len);

    /* Copy the save parameters, so that when derive_keys chooses the
     * number of Argon2 passes, it can write the result back to our
     * copy for us to retrieve. */
    ppk_save_parameters params = *params_orig;

    strbuf *passphrase_salt = strbuf_new();

    if (params.fmt_version == 3) {
        /* Invent a salt for the password hash. */
        if (params.salt)
            put_data(passphrase_salt, params.salt, params.saltlen);
        else
            random_read(strbuf_append(passphrase_salt, 16), 16);
    }

    cipher_mac_keys_blob = strbuf_new();
    ssh2_ppk_derive_keys(params.fmt_version, ciphertype,
                         ptrlen_from_asciz(passphrase ? passphrase : ""),
                         cipher_mac_keys_blob, &cipherkey, &cipheriv, &mackey,
                         ptrlen_from_strbuf(passphrase_salt), &params);

    const ssh2_macalg *macalg = (params.fmt_version == 2 ?
                                 &ssh_hmac_sha1 : &ssh_hmac_sha256);

    /* Now create the MAC. */
    {
        strbuf *macdata;

        macdata = strbuf_new_nm();
        put_stringz(macdata, ssh_key_ssh_id(key->key));
        put_stringz(macdata, cipherstr);
        put_stringz(macdata, key->comment);
        put_string(macdata, pub_blob->s, pub_blob->len);
        put_string(macdata, priv_blob_encrypted, priv_encrypted_len);

        mac_simple(macalg, mackey, ptrlen_from_strbuf(macdata), priv_mac);
        strbuf_free(macdata);
    }

    if (passphrase) {
        assert(cipherkey.len == 32);
        aes256_encrypt_pubkey(cipherkey.ptr, cipheriv.ptr,
                              priv_blob_encrypted, priv_encrypted_len);
    }

    strbuf *out = strbuf_new_nm();
    put_fmt(out, "PuTTY-User-Key-File-%u: %s\n",
            params.fmt_version, ssh_key_ssh_id(key->key));
    put_fmt(out, "Encryption: %s\n", cipherstr);
    put_fmt(out, "Comment: %s\n", key->comment);
    put_fmt(out, "Public-Lines: %d\n", base64_lines(pub_blob->len));
    base64_encode_bs(BinarySink_UPCAST(out), ptrlen_from_strbuf(pub_blob), 64);
    if (params.fmt_version == 3 && ciphertype->keylen != 0) {
        put_fmt(out, "Key-Derivation: %s\n",
                params.argon2_flavour == Argon2d ? "Argon2d" :
                params.argon2_flavour == Argon2i ? "Argon2i" : "Argon2id");
        put_fmt(out, "Argon2-Memory: %"PRIu32"\n", params.argon2_mem);
        assert(!params.argon2_passes_auto);
        put_fmt(out, "Argon2-Passes: %"PRIu32"\n", params.argon2_passes);
        put_fmt(out, "Argon2-Parallelism: %"PRIu32"\n",
                params.argon2_parallelism);
        put_fmt(out, "Argon2-Salt: ");
        for (size_t i = 0; i < passphrase_salt->len; i++)
            put_fmt(out, "%02x", passphrase_salt->u[i]);
        put_fmt(out, "\n");
    }
    put_fmt(out, "Private-Lines: %d\n", base64_lines(priv_encrypted_len));
    base64_encode_bs(BinarySink_UPCAST(out),
                     make_ptrlen(priv_blob_encrypted, priv_encrypted_len), 64);
    put_fmt(out, "Private-MAC: ");
    for (i = 0; i < macalg->len; i++)
        put_fmt(out, "%02x", priv_mac[i]);
    put_fmt(out, "\n");

    strbuf_free(cipher_mac_keys_blob);
    strbuf_free(passphrase_salt);
    strbuf_free(pub_blob);
    strbuf_free(priv_blob);
    smemclr(priv_blob_encrypted, priv_encrypted_len);
    sfree(priv_blob_encrypted);
    return out;
}